

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

size_t __thiscall edition_unittest::TestMutualRecursionA::ByteSizeLong(TestMutualRecursionA *this)

{
  RepeatedPtrField<edition_unittest::TestMutualRecursionA_SubGroupR> *this_00;
  anon_union_48_1_493b367e_for_TestMutualRecursionA_3 aVar1;
  void **ppvVar2;
  const_iterator cVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar5 = (long)*(int *)((long)&this->field_0 + 0x10) * 2;
  this_00 = &(this->field_0)._impl_.subgroupr_;
  ppvVar2 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&this_00->super_RepeatedPtrFieldBase);
  cVar3 = google::protobuf::RepeatedPtrField<edition_unittest::TestMutualRecursionA_SubGroupR>::end
                    (this_00);
  for (; ppvVar2 != cVar3.it_; ppvVar2 = ppvVar2 + 1) {
    sVar4 = TestMutualRecursionA_SubGroupR::ByteSizeLong((TestMutualRecursionA_SubGroupR *)*ppvVar2)
    ;
    sVar5 = sVar5 + sVar4;
  }
  aVar1 = this->field_0;
  if (((undefined1  [48])aVar1 & (undefined1  [48])0x3) != (undefined1  [48])0x0) {
    if (((undefined1  [48])aVar1 & (undefined1  [48])0x1) != (undefined1  [48])0x0) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSize<edition_unittest::TestMutualRecursionB>((this->field_0)._impl_.bb_);
      sVar5 = sVar5 + sVar4 + 1;
    }
    if (((undefined1  [48])aVar1 & (undefined1  [48])0x2) != (undefined1  [48])0x0) {
      sVar4 = TestMutualRecursionA_SubGroup::ByteSizeLong((this->field_0)._impl_.subgroup_);
      sVar5 = sVar5 + sVar4 + 2;
    }
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t TestMutualRecursionA::ByteSizeLong() const {
  const TestMutualRecursionA& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestMutualRecursionA)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .edition_unittest.TestMutualRecursionA.SubGroupR subgroupr = 5 [features = {
    {
      total_size += 2UL * this_._internal_subgroupr_size();
      for (const auto& msg : this_._internal_subgroupr()) {
        total_size += ::google::protobuf::internal::WireFormatLite::GroupSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // .edition_unittest.TestMutualRecursionB bb = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.bb_);
    }
    // .edition_unittest.TestMutualRecursionA.SubGroup subgroup = 2 [features = {
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::GroupSize(*this_._impl_.subgroup_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}